

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O2

bool __thiscall mkvmuxer::MkvWriter::Open(MkvWriter *this,char *filename)

{
  FILE *pFVar1;
  bool bVar2;
  
  if (filename != (char *)0x0) {
    if (this->file_ == (FILE *)0x0) {
      pFVar1 = fopen(filename,"wb");
      this->file_ = (FILE *)pFVar1;
      bVar2 = pFVar1 != (FILE *)0x0;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool MkvWriter::Open(const char* filename) {
  if (filename == NULL)
    return false;

  if (file_)
    return false;

#ifdef _MSC_VER
  file_ = _fsopen(filename, "wb", _SH_DENYWR);
#else
  file_ = fopen(filename, "wb");
#endif
  if (file_ == NULL)
    return false;
  return true;
}